

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

string __thiscall mjs::anon_unknown_35::string_cache::get(string_cache *this,gc_heap *h,char *name)

{
  entry eVar1;
  string_cache *this_00;
  char *h_00;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  entry *peVar6;
  gc_string *this_01;
  entry *peVar7;
  gc_heap_ptr<mjs::gc_string> *p;
  string_cache *in_RCX;
  wchar_t *pwVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar9;
  string sVar10;
  wstring_view v;
  gc_heap_weak_ptr_untracked<gc_string> gStack_98;
  uint32_t local_94;
  uint32_t local_90;
  uint32_t i_1;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  undefined1 local_75;
  gc_heap_ptr<mjs::gc_string> local_68;
  wstring_view local_58;
  uint local_48;
  uint local_44;
  uint32_t l;
  uint32_t i;
  entry *es_data;
  gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *es;
  string_cache *psStack_28;
  uint32_t hash;
  char *name_local;
  gc_heap *h_local;
  string_cache *this_local;
  string *s;
  
  psStack_28 = in_RCX;
  name_local = name;
  h_local = h;
  this_local = this;
  es._4_4_ = calc_hash((char *)in_RCX);
  es_data = (entry *)gc_heap_ptr_untracked<mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>,_true>
                     ::dereference((gc_heap_ptr_untracked<mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>,_true>
                                    *)h,(gc_heap *)name_local);
  _l = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::data
                 ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)es_data);
  local_44 = 0;
  local_48 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::length
                       ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)es_data);
  for (; h_00 = name_local, local_44 < local_48; local_44 = local_44 + 1) {
    peVar6 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::operator[]
                       ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)es_data,
                        local_44);
    bVar2 = mjs::gc_heap_ptr_untracked::operator_cast_to_bool((gc_heap_ptr_untracked *)&peVar6->s);
    this_00 = psStack_28;
    if (bVar2) {
      pwVar8 = (wchar_t *)(ulong)local_44;
      if (_l[(long)pwVar8].hash == es._4_4_) {
        this_01 = gc_heap_ptr_untracked<mjs::gc_string,_false>::dereference
                            (&_l[local_44].s,(gc_heap *)name_local);
        local_58 = gc_string::view(this_01);
        v._M_str = pwVar8;
        v._M_len = (size_t)local_58._M_str;
        bVar2 = string_equal(this_00,(char *)local_58._M_len,v);
        if (bVar2) goto LAB_00174b1a;
      }
    }
    else {
      gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::erase
                ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)es_data,local_44);
      local_44 = local_44 - 1;
      local_48 = local_48 - 1;
    }
  }
  local_75 = 0;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_88,(char *)psStack_28);
  string::string((string *)this,(gc_heap *)h_00,&local_88);
  uVar3 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::length
                    ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)es_data);
  uVar4 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::capacity
                    ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)es_data);
  peVar6 = es_data;
  if (uVar3 < uVar4) {
    local_90 = 0;
    gc_heap_ptr_untracked<mjs::gc_string,_false>::gc_heap_ptr_untracked
              ((gc_heap_ptr_untracked<mjs::gc_string,_false> *)&i_1,(nullptr_t)0x0);
    gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::push_back
              ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)peVar6,
               (entry *)&stack0xffffffffffffff70);
    peVar6 = _l;
    peVar7 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::data
                       ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)es_data);
    if (peVar6 != peVar7) {
      __assert_fail("es_data == es.data()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                    ,0x1ec,
                    "string mjs::(anonymous namespace)::string_cache::get(gc_heap &, const char *)")
      ;
    }
  }
  local_94 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::length
                       ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)es_data);
  uVar3 = es._4_4_;
  while (uVar5 = local_94 - 1, uVar5 != 0) {
    _l[uVar5] = _l[local_94 - 2];
    local_94 = uVar5;
  }
  local_94 = uVar5;
  p = string::unsafe_raw_get((string *)this);
  gc_heap_ptr_untracked<mjs::gc_string,_false>::gc_heap_ptr_untracked(&gStack_98,p);
  eVar1.s.pos_ = gStack_98.pos_;
  eVar1.hash = uVar3;
  *_l = eVar1;
  uVar9 = extraout_RDX_00;
LAB_00174d89:
  sVar10.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = uVar9;
  sVar10.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar10.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
LAB_00174b1a:
  for (; local_44 != 0; local_44 = local_44 - 1) {
    std::swap<mjs::(anonymous_namespace)::string_cache::entry>(_l + local_44,_l + (local_44 - 1));
  }
  gc_heap_ptr_untracked<mjs::gc_string,_false>::track
            ((gc_heap_ptr_untracked<mjs::gc_string,_false> *)&local_68,(gc_heap *)&_l->s);
  string::string((string *)this,&local_68);
  gc_heap_ptr<mjs::gc_string>::~gc_heap_ptr(&local_68);
  uVar9 = extraout_RDX;
  goto LAB_00174d89;
}

Assistant:

string get(gc_heap& h, const char* name) {
        const auto hash = calc_hash(name);

#ifdef STRING_CACHE_STATS
        ++lookups_;
#endif
        auto& es = entries_.dereference(h);
        auto es_data = es.data(); // Size we never go beyond the initial capacity the data pointer can't change in below

        // In cache already?
        for (uint32_t i = 0, l = es.length(); i < l; ++i) {
            // Check if we encounterd a "lost" weak pointer (only happens first time after a garbage collection)
            if (!es[i].s) {
                // Debugging note: Decrease the size of the cache to force this branch to occur (and increase rate of garbage collection)
                es.erase(i);
                --i; // Redo this one
                --l; // Length changed but we don't want to call es.length() again
                continue;
            }

            if (es_data[i].hash == hash && string_equal(name, es_data[i].s.dereference(h).view())) {
#ifdef STRING_CACHE_STATS
                ++hits_;
                dist_ += i;
#endif
                // Move first
                for (; i; --i) {
                    std::swap(es_data[i], es_data[i-1]);
                }
                return es_data[0].s.track(h);
            }
        }

        // No. Move existing entries up
        string s{h, name};

        if (es.length() < es.capacity()) {
            es.push_back(entry{0, nullptr});
            assert(es_data == es.data());
        }

        for (uint32_t i = es.length(); --i; ) {
            es_data[i] = es_data[i-1];
        }

        es_data[0] = { hash, s.unsafe_raw_get() };

        return s;
    }